

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

int re2::RE2::MaxSubmatch(StringPiece *rewrite)

{
  int iVar1;
  char *pcVar2;
  int local_3c;
  int n;
  int c;
  char *end;
  char *s;
  int max;
  StringPiece *rewrite_local;
  
  s._4_4_ = 0;
  end = StringPiece::data(rewrite);
  iVar1 = StringPiece::size(rewrite);
  pcVar2 = end + iVar1;
  for (; end < pcVar2; end = end + 1) {
    if (*end == '\\') {
      end = end + 1;
      if (end < pcVar2) {
        local_3c = (int)*end;
      }
      else {
        local_3c = -1;
      }
      iVar1 = isdigit(local_3c);
      if ((iVar1 != 0) && (s._4_4_ < local_3c + -0x30)) {
        s._4_4_ = local_3c + -0x30;
      }
    }
  }
  return s._4_4_;
}

Assistant:

int RE2::MaxSubmatch(const StringPiece& rewrite) {
  int max = 0;
  for (const char *s = rewrite.data(), *end = s + rewrite.size();
       s < end; s++) {
    if (*s == '\\') {
      s++;
      int c = (s < end) ? *s : -1;
      if (isdigit(c)) {
        int n = (c - '0');
        if (n > max)
          max = n;
      }
    }
  }
  return max;
}